

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O0

void d68010_moves_8(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uVar4;
  uint extension;
  
  if ((g_cpu_type & 0x1e) == 0) {
    if ((g_cpu_ir & 0xf000) == 0xf000) {
      d68000_1111();
    }
    else {
      d68000_illegal();
    }
  }
  else {
    uVar1 = dasm_read_imm_16(2);
    if ((uVar1 & 0x800) == 0) {
      pcVar3 = get_ea_mode_str(g_cpu_ir,0);
      uVar4 = 0x44;
      if ((uVar1 & 0x8000) != 0) {
        uVar4 = 0x41;
      }
      sprintf(g_dasm_str,"moves.b %s, %c%d; (1+)",pcVar3,uVar4,(ulong)(uVar1 >> 0xc & 7));
    }
    else {
      uVar2 = 0x44;
      if ((uVar1 & 0x8000) != 0) {
        uVar2 = 0x41;
      }
      pcVar3 = get_ea_mode_str(g_cpu_ir,0);
      sprintf(g_dasm_str,"moves.b %c%d, %s; (1+)",(ulong)uVar2,(ulong)(uVar1 >> 0xc & 7),pcVar3);
    }
  }
  return;
}

Assistant:

static void d68010_moves_8(void)
{
	uint extension;
	LIMIT_CPU_TYPES(M68010_PLUS);
	extension = read_imm_16();
	if(BIT_B(extension))
		sprintf(g_dasm_str, "moves.b %c%d, %s; (1+)", BIT_F(extension) ? 'A' : 'D', (extension>>12)&7, get_ea_mode_str_8(g_cpu_ir));
	else
		sprintf(g_dasm_str, "moves.b %s, %c%d; (1+)", get_ea_mode_str_8(g_cpu_ir), BIT_F(extension) ? 'A' : 'D', (extension>>12)&7);
}